

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

void Ivy_ManPrintStats(Ivy_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_18;
  Ivy_Man_t *p_local;
  
  uVar1 = Ivy_ManPiNum(p);
  uVar2 = Ivy_ManPoNum(p);
  printf("PI/PO = %d/%d ",(ulong)uVar1,(ulong)uVar2);
  uVar1 = Ivy_ManAndNum(p);
  printf("A = %7d. ",(ulong)uVar1);
  uVar1 = Ivy_ManLatchNum(p);
  printf("L = %5d. ",(ulong)uVar1);
  uVar1 = Ivy_ManObjIdMax(p);
  printf("MaxID = %7d. ",(ulong)uVar1);
  iVar3 = Ivy_ManLatchNum(p);
  if (iVar3 == 0) {
    local_18 = Ivy_ManLevels(p);
  }
  else {
    local_18 = 0xffffffff;
  }
  printf("Lev = %3d. ",(ulong)local_18);
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void Ivy_ManPrintStats( Ivy_Man_t * p )
{
    printf( "PI/PO = %d/%d ", Ivy_ManPiNum(p), Ivy_ManPoNum(p) );
    printf( "A = %7d. ",       Ivy_ManAndNum(p) );
    printf( "L = %5d. ",       Ivy_ManLatchNum(p) );
//    printf( "X = %d. ",       Ivy_ManExorNum(p) );
//    printf( "B = %3d. ",       Ivy_ManBufNum(p) );
    printf( "MaxID = %7d. ",   Ivy_ManObjIdMax(p) );
//    printf( "Cre = %d. ",     p->nCreated );
//    printf( "Del = %d. ",     p->nDeleted );
    printf( "Lev = %3d. ",     Ivy_ManLatchNum(p)? -1 : Ivy_ManLevels(p) );
    printf( "\n" );
    fflush( stdout );
}